

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<capnp::LocalRequest> __thiscall
kj::
heap<capnp::LocalRequest,unsigned_long&,unsigned_short&,kj::Maybe<capnp::MessageSize>&,kj::Own<capnp::LocalClient>>
          (kj *this,unsigned_long *params,unsigned_short *params_1,
          Maybe<capnp::MessageSize> *params_2,Own<capnp::LocalClient> *params_3)

{
  uint16_t methodId;
  uint64_t interfaceId;
  LocalRequest *this_00;
  unsigned_long *puVar1;
  unsigned_short *puVar2;
  Maybe<capnp::MessageSize> *other;
  Own<capnp::LocalClient> *other_00;
  LocalRequest *extraout_RDX;
  Own<capnp::LocalRequest> OVar3;
  Own<capnp::ClientHook> local_68 [2];
  Maybe<capnp::MessageSize> local_48;
  Own<capnp::LocalClient> *local_30;
  Own<capnp::LocalClient> *params_local_3;
  Maybe<capnp::MessageSize> *params_local_2;
  unsigned_short *params_local_1;
  unsigned_long *params_local;
  
  local_30 = params_3;
  params_local_3 = (Own<capnp::LocalClient> *)params_2;
  params_local_2 = (Maybe<capnp::MessageSize> *)params_1;
  params_local_1 = (unsigned_short *)params;
  params_local = (unsigned_long *)this;
  this_00 = (LocalRequest *)operator_new(0x38);
  puVar1 = fwd<unsigned_long&>((unsigned_long *)params_local_1);
  interfaceId = *puVar1;
  puVar2 = fwd<unsigned_short&>((unsigned_short *)params_local_2);
  methodId = *puVar2;
  other = fwd<kj::Maybe<capnp::MessageSize>&>((Maybe<capnp::MessageSize> *)params_local_3);
  Maybe<capnp::MessageSize>::Maybe(&local_48,other);
  other_00 = fwd<kj::Own<capnp::LocalClient>>(local_30);
  Own<capnp::ClientHook>::Own<capnp::LocalClient,void>(local_68,other_00);
  capnp::LocalRequest::LocalRequest(this_00,interfaceId,methodId,&local_48,local_68);
  Own<capnp::LocalRequest>::Own
            ((Own<capnp::LocalRequest> *)this,this_00,
             (Disposer *)&_::HeapDisposer<capnp::LocalRequest>::instance);
  Own<capnp::ClientHook>::~Own(local_68);
  Maybe<capnp::MessageSize>::~Maybe(&local_48);
  OVar3.ptr = extraout_RDX;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}